

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o2.cc
# Opt level: O3

VectorXd __thiscall lf::geometry::TriaO2::IntegrationElement(TriaO2 *this,MatrixXd *local)

{
  Index size;
  Scalar SVar1;
  ReturnType RVar2;
  int iVar3;
  Scalar *pSVar4;
  runtime_error *this_00;
  double *pdVar5;
  long lVar6;
  long in_RDX;
  Index extraout_RDX;
  bool bVar7;
  long lVar8;
  double dVar9;
  long lVar10;
  long lVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  VectorXd VVar12;
  VectorXd *intElem;
  MatrixXd jac;
  Type jacobian;
  ColXpr B;
  stringstream ss;
  string local_2b8;
  undefined1 local_298 [16];
  double local_288;
  undefined1 local_280 [56];
  undefined1 local_248 [16];
  undefined1 local_230 [16];
  Matrix<double,__1,__1,_0,__1,__1> local_220 [3];
  Lhs local_1c8;
  Rhs local_1c0;
  undefined1 local_1b8 [24];
  scalar_constant_op<double> local_1a0;
  RhsNested local_198;
  
  local_280._0_8_ = (pointer)0x0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_230,*(Index *)(in_RDX + 8),*(Index *)(in_RDX + 0x10),
                   (scalar_constant_op<double> *)local_280);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)local_1b8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_230,&local_1c0,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)local_280);
  lVar6 = ((local_198.m_expression)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar6) {
    pdVar5 = ((local_198.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar11 = ((local_198.m_expression)->
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    bVar7 = false;
    lVar8 = 0;
    do {
      if (0 < lVar11) {
        lVar10 = 0;
        do {
          if (pdVar5[lVar10] < local_1a0.m_other) goto LAB_002b6bfd;
          lVar10 = lVar10 + 1;
        } while (lVar11 != lVar10);
      }
      lVar8 = lVar8 + 1;
      pdVar5 = pdVar5 + lVar11;
      bVar7 = lVar6 <= lVar8;
    } while (lVar8 != lVar6);
LAB_002b6bfd:
    if (!bVar7) goto LAB_002b6e68;
  }
  local_2b8._M_dataplus._M_p = &DAT_3ff0000000000000;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                    *)local_280,*(Index *)(in_RDX + 8),*(Index *)(in_RDX + 0x10),
                   (scalar_constant_op<double> *)&local_2b8);
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>
                   *)local_230,&local_1c8,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                   *)local_280,
                  (scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)2> *)&local_2b8);
  if (0 < (long)local_220[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data) {
    lVar6 = *(long *)local_230._0_8_;
    bVar7 = false;
    dVar9 = 0.0;
    do {
      if (0 < (long)local_230._8_8_) {
        lVar11 = 0;
        do {
          if ((double)local_220[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows < *(double *)(lVar6 + lVar11 * 8)) goto LAB_002b6cad;
          lVar11 = lVar11 + 1;
        } while (local_230._8_8_ != lVar11);
      }
      dVar9 = (double)((long)dVar9 + 1);
      lVar6 = lVar6 + *(Index *)(local_230._0_8_ + 8) * 8;
      bVar7 = (long)local_220[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data <= (long)dVar9;
    } while ((double *)dVar9 !=
             local_220[0].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
             .m_data);
LAB_002b6cad:
    if (!bVar7) {
LAB_002b6e68:
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),
                 "local coordinates out of bounds for reference element",0x35);
      local_230._0_8_ = local_220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_230,"(0. <= local.array()).all() && (local.array() <= 1.).all()",""
                );
      local_280._0_8_ = local_280 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_280,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/tria_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_230,(string *)local_280,0x7d,&local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
        operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
      }
      if ((Matrix<double,__1,__1,_0,__1,__1> *)local_230._0_8_ != local_220) {
        operator_delete((void *)local_230._0_8_,
                        (long)local_220[0].
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data + 1);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  (*(code *)(local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_data[4])(&local_2b8,local);
  size = *(Index *)(in_RDX + 0x10);
  (this->super_Geometry)._vptr_Geometry = (_func_int **)0x0;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_6,_0,__1,_6>_>.m_storage.m_data =
       (double *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,size);
  iVar3 = (*(code *)(local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_data[1])(local);
  if (iVar3 == 2) {
    if (0 < *(long *)(in_RDX + 0x10)) {
      lVar6 = 0;
      lVar11 = 0;
      do {
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_1b8,
                   (Matrix<double,__1,__1,_0,__1,__1> *)&local_2b8,0,lVar6,2,2);
        SVar1 = Eigen::
                MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::
                determinant((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                             *)local_1b8);
        local_298._8_4_ = extraout_XMM0_Dc;
        local_298._0_8_ = SVar1;
        local_298._12_4_ = extraout_XMM0_Dd;
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,
                            lVar11);
        *pSVar4 = ABS((double)local_298._0_8_);
        lVar11 = lVar11 + 1;
        lVar6 = lVar6 + 2;
      } while (lVar11 < *(long *)(in_RDX + 0x10));
    }
  }
  else if (0 < *(long *)(in_RDX + 0x10)) {
    lVar11 = 0;
    lVar6 = 0;
    do {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_280,
                 (Matrix<double,__1,__1,_0,__1,__1> *)&local_2b8,0,lVar11,local_2b8._M_string_length
                 ,2);
      Eigen::
      Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>::
      Block((Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>
             *)local_1b8,(Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_280
            ,0);
      Eigen::
      Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>::
      Block((Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>
             *)local_230,(Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_280
            ,1);
      RVar2 = Eigen::
              MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,true>>
              ::
              dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                        ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                          *)local_1b8,
                         (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                          *)local_230);
      local_298._0_8_ = RVar2;
      RVar2 = Eigen::
              MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,true>>
              ::
              dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                        ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                          *)local_1b8,
                         (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                          *)local_1b8);
      local_248._8_4_ = extraout_XMM0_Dc_00;
      local_248._0_8_ = RVar2;
      local_248._12_4_ = extraout_XMM0_Dd_00;
      local_288 = Eigen::
                  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,1,true>>
                  ::
                  dot<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                            ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,1,true>>
                              *)local_230,
                             (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                              *)local_230);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,lVar6);
      *pSVar4 = SQRT(ABS((double)local_248._0_8_ * local_288 -
                         (double)local_298._0_8_ * (double)local_298._0_8_));
      lVar6 = lVar6 + 1;
      lVar11 = lVar11 + 2;
    } while (lVar6 < *(long *)(in_RDX + 0x10));
  }
  free(local_2b8._M_dataplus._M_p);
  VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar12.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd TriaO2::IntegrationElement(const Eigen::MatrixXd& local) const {
  LF_VERIFY_MSG((0. <= local.array()).all() && (local.array() <= 1.).all(),
                "local coordinates out of bounds for reference element");

  Eigen::MatrixXd jac = Jacobian(local);
  Eigen::VectorXd intElem(local.cols());

  if (DimGlobal() == 2) {
    for (long i = 0; i < local.cols(); ++i) {
      intElem(i) = std::abs(jac.block(0, 2 * i, 2, 2).determinant());
    }
  } else {
    for (long i = 0; i < local.cols(); ++i) {
      auto jacobian = jac.block(0, 2 * i, jac.rows(), 2);

      auto A = jacobian.col(0);
      auto B = jacobian.col(1);
      auto AB = A.dot(B);

      intElem(i) = std::sqrt(std::abs(A.dot(A) * B.dot(B) - AB * AB));
    }
  }
  return intElem;
}